

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yprc_dflt_value(lys_ypr_ctx *pctx,ly_ctx *ly_pctx,lyd_value *value,lysc_ext_instance *exts)

{
  undefined8 in_RAX;
  char *text;
  ly_bool dynamic;
  ly_bool local_21;
  
  local_21 = (ly_bool)((ulong)in_RAX >> 0x38);
  text = (char *)(*value->realtype->plugin->print)
                           (ly_pctx,value,LY_VALUE_JSON,(void *)0x0,&local_21,(size_t *)0x0);
  ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',text,'\0',exts);
  if (local_21 != '\0') {
    free(text);
  }
  return;
}

Assistant:

static void
yprc_dflt_value(struct lys_ypr_ctx *pctx, const struct ly_ctx *ly_pctx, const struct lyd_value *value,
        struct lysc_ext_instance *exts)
{
    ly_bool dynamic;
    const char *str;

    str = value->realtype->plugin->print(ly_pctx, value, LY_VALUE_JSON, NULL, &dynamic, NULL);
    ypr_substmt(pctx, LY_STMT_DEFAULT, 0, str, 0, exts);
    if (dynamic) {
        free((void *)str);
    }
}